

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_crt_verify_top(mbedtls_x509_crt *child,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
                       mbedtls_x509_crt_profile *profile,int path_cnt,uint32_t *flags,
                       _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy
                       )

{
  mbedtls_pk_type_t type;
  void *options;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  undefined4 in_register_00000084;
  int iVar6;
  uint32_t ca_flags;
  uint *local_a8;
  undefined8 local_a0;
  uint local_98;
  mbedtls_md_type_t local_94;
  mbedtls_x509_crt_profile *local_90;
  mbedtls_x509_crl *local_88;
  mbedtls_md_info_t *local_80;
  uchar hash [64];
  
  local_a0 = CONCAT44(in_register_00000084,path_cnt);
  ca_flags = 0;
  local_88 = ca_crl;
  iVar2 = mbedtls_x509_time_is_past(&child->valid_to);
  if (iVar2 != 0) {
    *(byte *)flags = (byte)*flags | 1;
  }
  iVar2 = mbedtls_x509_time_is_future(&child->valid_from);
  if (iVar2 != 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 2;
  }
  if ((profile->allowed_mds >> ((byte)((char)child->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x40;
  }
  if ((profile->allowed_pks >> ((byte)((char)child->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x80;
  }
  *(byte *)flags = (byte)*flags | 8;
  local_80 = mbedtls_md_info_from_type(child->sig_md);
  local_a8 = flags;
  local_90 = profile;
  if (local_80 == (mbedtls_md_info_t *)0x0) {
    trust_ca = (mbedtls_x509_crt *)0x0;
  }
  else {
    mbedtls_md(local_80,(child->tbs).p,(child->tbs).len,hash);
  }
  if (trust_ca != (mbedtls_x509_crt *)0x0) {
    iVar2 = (int)local_a0;
    uVar4 = (uint)(iVar2 == 0);
    iVar6 = iVar2 + 1;
    local_98 = (uint)(iVar2 == 0);
    do {
      iVar2 = x509_crt_check_parent(child,trust_ca,1,uVar4);
      if (iVar2 == 0) {
        iVar2 = iVar6;
        if ((child->subject_raw).len == (trust_ca->subject_raw).len) {
          iVar3 = bcmp((child->subject_raw).p,(trust_ca->subject_raw).p,(child->issuer_raw).len);
          iVar2 = (int)local_a0;
          if (iVar3 != 0) {
            iVar2 = iVar6;
          }
        }
        if ((trust_ca->max_pathlen < 1) || (iVar2 <= trust_ca->max_pathlen)) {
          local_94 = child->sig_md;
          type = child->sig_pk;
          options = child->sig_opts;
          bVar1 = mbedtls_md_get_size(local_80);
          uVar4 = local_98;
          iVar2 = mbedtls_pk_verify_ext
                            (type,options,&trust_ca->pk,local_94,hash,(ulong)bVar1,(child->sig).p,
                             (child->sig).len);
          puVar5 = local_a8;
          if (iVar2 == 0) {
            *(byte *)local_a8 = (byte)*local_a8 & 0xf7;
            iVar2 = x509_profile_check_key(local_90,child->sig_pk,&trust_ca->pk);
            if (iVar2 != 0) {
              *(byte *)((long)puVar5 + 2) = *(byte *)((long)puVar5 + 2) | 1;
            }
            if (((child->subject_raw).len != (trust_ca->subject_raw).len) ||
               (iVar2 = bcmp((child->subject_raw).p,(trust_ca->subject_raw).p,
                             (child->issuer_raw).len), iVar2 != 0)) {
              uVar4 = x509_crt_verifycrl(child,trust_ca,local_88,local_90);
              puVar5 = local_a8;
              *local_a8 = *local_a8 | uVar4;
              iVar2 = mbedtls_x509_time_is_past(&trust_ca->valid_to);
              if (iVar2 != 0) {
                ca_flags = ca_flags | 1;
              }
              iVar2 = mbedtls_x509_time_is_future(&trust_ca->valid_from);
              if (iVar2 != 0) {
                ca_flags = ca_flags | 0x200;
              }
              if (f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0)
              goto LAB_0013b7b3;
              iVar2 = (*f_vrfy)(p_vrfy,trust_ca,iVar6,&ca_flags);
              if (iVar2 != 0) {
                return iVar2;
              }
            }
            break;
          }
        }
      }
      trust_ca = trust_ca->next;
    } while (trust_ca != (mbedtls_x509_crt *)0x0);
  }
  puVar5 = local_a8;
  if ((f_vrfy == (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) ||
     (iVar2 = (*f_vrfy)(p_vrfy,child,(int)local_a0,local_a8), iVar2 == 0)) {
LAB_0013b7b3:
    *puVar5 = *puVar5 | ca_flags;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int x509_crt_verify_top(
                mbedtls_x509_crt *child, mbedtls_x509_crt *trust_ca,
                mbedtls_x509_crl *ca_crl,
                const mbedtls_x509_crt_profile *profile,
                int path_cnt, uint32_t *flags,
                int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                void *p_vrfy )
{
    int ret;
    uint32_t ca_flags = 0;
    int check_path_cnt;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;

    if( mbedtls_x509_time_is_past( &child->valid_to ) )
        *flags |= MBEDTLS_X509_BADCERT_EXPIRED;

    if( mbedtls_x509_time_is_future( &child->valid_from ) )
        *flags |= MBEDTLS_X509_BADCERT_FUTURE;

    if( x509_profile_check_md_alg( profile, child->sig_md ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_MD;

    if( x509_profile_check_pk_alg( profile, child->sig_pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    /*
     * Child is the top of the chain. Check against the trust_ca list.
     */
    *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( md_info == NULL )
    {
        /*
         * Cannot check 'unknown', no need to try any CA
         */
        trust_ca = NULL;
    }
    else
        mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash );

    for( /* trust_ca */ ; trust_ca != NULL; trust_ca = trust_ca->next )
    {
        if( x509_crt_check_parent( child, trust_ca, 1, path_cnt == 0 ) != 0 )
            continue;

        check_path_cnt = path_cnt + 1;

        /*
         * Reduce check_path_cnt to check against if top of the chain is
         * the same as the trusted CA
         */
        if( child->subject_raw.len == trust_ca->subject_raw.len &&
            memcmp( child->subject_raw.p, trust_ca->subject_raw.p,
                            child->issuer_raw.len ) == 0 )
        {
            check_path_cnt--;
        }

        if( trust_ca->max_pathlen > 0 &&
            trust_ca->max_pathlen < check_path_cnt )
        {
            continue;
        }

        if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &trust_ca->pk,
                           child->sig_md, hash, mbedtls_md_get_size( md_info ),
                           child->sig.p, child->sig.len ) != 0 )
        {
            continue;
        }

        /*
         * Top of chain is signed by a trusted CA
         */
        *flags &= ~MBEDTLS_X509_BADCERT_NOT_TRUSTED;

        if( x509_profile_check_key( profile, child->sig_pk, &trust_ca->pk ) != 0 )
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

        break;
    }

    /*
     * If top of chain is not the same as the trusted CA send a verify request
     * to the callback for any issues with validity and CRL presence for the
     * trusted CA certificate.
     */
    if( trust_ca != NULL &&
        ( child->subject_raw.len != trust_ca->subject_raw.len ||
          memcmp( child->subject_raw.p, trust_ca->subject_raw.p,
                            child->issuer_raw.len ) != 0 ) )
    {
#if defined(MBEDTLS_X509_CRL_PARSE_C)
        /* Check trusted CA's CRL for the chain's top crt */
        *flags |= x509_crt_verifycrl( child, trust_ca, ca_crl, profile );
#else
        ((void) ca_crl);
#endif

        if( mbedtls_x509_time_is_past( &trust_ca->valid_to ) )
            ca_flags |= MBEDTLS_X509_BADCERT_EXPIRED;

        if( mbedtls_x509_time_is_future( &trust_ca->valid_from ) )
            ca_flags |= MBEDTLS_X509_BADCERT_FUTURE;

        if( NULL != f_vrfy )
        {
            if( ( ret = f_vrfy( p_vrfy, trust_ca, path_cnt + 1,
                                &ca_flags ) ) != 0 )
            {
                return( ret );
            }
        }
    }

    /* Call callback on top cert */
    if( NULL != f_vrfy )
    {
        if( ( ret = f_vrfy( p_vrfy, child, path_cnt, flags ) ) != 0 )
            return( ret );
    }

    *flags |= ca_flags;

    return( 0 );
}